

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

ssize_t __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  RpcConnectionState *pRVar4;
  RpcClient *pRVar5;
  void *pvVar6;
  undefined8 uVar7;
  PointerReader other;
  size_t sVar8;
  size_t sVar9;
  ArrayDisposer *pAVar10;
  uint uVar11;
  RpcPipeline *this_00;
  uint uVar12;
  size_t __n_00;
  void *__buf_00;
  PromiseNode *ptrCopy;
  undefined4 in_register_00000034;
  RpcRequest *this_01;
  int __flags_00;
  undefined1 *puVar13;
  Refcounted *pRVar14;
  anon_union_400_1_a8a2e026_for_OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>_2
  *other_00;
  MessageSizeCounts MVar15;
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
  forkedPromise;
  undefined1 local_418 [24];
  EventLoop *local_400;
  char *local_3f8;
  Event **ppEStack_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0 [8];
  char *local_3d8;
  uint local_3d0;
  undefined8 local_3c8;
  OwnPromiseNode OStack_3c0;
  ExceptionOrValue *local_3b8;
  ForkBranchBase *pFStack_3b0;
  undefined1 local_398 [32];
  Exception local_378;
  Exception local_1e8;
  StructBuilder local_58;
  
  this_01 = (RpcRequest *)CONCAT44(in_register_00000034,__fd);
  pRVar4 = (this_01->connectionState).ptr;
  if ((pRVar4->connection).tag == 1) {
    pRVar5 = (this_01->target).ptr;
    local_378.ownFile.content.ptr = (char *)(this_01->callBuilder)._builder.segment;
    local_378.ownFile.content.size_ = (size_t)(this_01->callBuilder)._builder.capTable;
    local_378.ownFile.content.disposer = (ArrayDisposer *)(this_01->callBuilder)._builder.pointers;
    PointerBuilder::getStruct
              (&local_58,(PointerBuilder *)(local_398 + 0x20),(StructSize)0x10001,(word *)0x0);
    (*(pRVar5->super_ClientHook)._vptr_ClientHook[10])(local_398 + 0x20,pRVar5);
    sVar8 = local_378.ownFile.content.size_;
    local_400 = (EventLoop *)local_378.ownFile.content.ptr;
    if ((CapTableReader *)local_378.ownFile.content.size_ == (CapTableReader *)0x0) {
      bVar2 = *(byte *)((long)(this_01->callBuilder)._builder.data + 0x10);
      sendInternal((SendInternalResult *)(local_398 + 0x20),this_01,false);
      if ((bVar2 & 2) == 0) {
        local_3f8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
        ;
        ppEStack_3f0 = (Event **)&DAT_00580f68;
        local_3e8._0_1_ = true;
        local_3e8._1_3_ = 9;
        local_3e8._4_4_ = 0x20;
        kj::
        Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::fork((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                *)&local_1e8);
        pRVar4 = (this_01->connectionState).ptr;
        kj::_::
        ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::addBranch((ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                     *)local_418);
        this_00 = (RpcPipeline *)operator_new(0x228);
        RpcPipeline::RpcPipeline
                  (this_00,pRVar4,
                   (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                   (local_398 + 0x20),
                   (Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                    *)local_418);
        uVar7 = local_418._0_8_;
        puVar1 = &(this_00->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        if ((PromiseArenaMember *)local_418._0_8_ != (PromiseArenaMember *)0x0) {
          local_418._0_8_ = (PromiseArenaMember *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar7);
        }
        kj::_::
        ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::addBranch((ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                     *)local_418);
        pAVar10 = local_378.ownFile.content.disposer;
        local_378.ownFile.content.disposer = (ArrayDisposer *)local_418._0_8_;
        local_418._0_8_ = (PromiseArenaMember *)0x0;
        if ((PromiseArenaMember *)pAVar10 != (PromiseArenaMember *)0x0) {
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pAVar10);
        }
        uVar7 = local_418._0_8_;
        if ((PromiseNode *)local_418._0_8_ != (PromiseNode *)0x0) {
          local_418._0_8_ = (PromiseArenaMember *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar7);
        }
        sVar9 = local_1e8.ownFile.content.size_;
        pRVar14 = &this_00->super_Refcounted;
        if ((RpcPipeline *)local_1e8.ownFile.content.size_ != (RpcPipeline *)0x0) {
          local_1e8.ownFile.content.size_ = 0;
          (**((Disposer *)local_1e8.ownFile.content.ptr)->_vptr_Disposer)
                    (local_1e8.ownFile.content.ptr,
                     (_func_int *)
                     ((long)&((PipelineHook *)sVar9)->_vptr_PipelineHook +
                     (long)((PipelineHook *)sVar9)->_vptr_PipelineHook[-2]));
        }
      }
      else {
        getDisabledPipeline();
        pRVar14 = (Refcounted *)local_1e8.ownFile.content.ptr;
        this_00 = (RpcPipeline *)local_1e8.ownFile.content.size_;
      }
      local_1e8.ownFile.content.ptr =
           (char *)kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2436:13)>
                   ::anon_class_1_0_00000001_for_func::operator();
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>,capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send()::_lambda(kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>&&)_1_>,kj::_::PromiseDisposer,capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send()::_lambda(kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>&&)_1_,void*&>
                ((PromiseDisposer *)local_418,(OwnPromiseNode *)&local_378.ownFile.content.disposer,
                 (anon_class_1_0_00000001_for_func *)(local_418 + 0x17),(void **)&local_1e8);
      pAVar10 = local_378.ownFile.content.disposer;
      (this->super_RequestHook)._vptr_RequestHook = (_func_int **)local_418._0_8_;
      (this->super_RequestHook).brand = pRVar14;
      (this->connectionState).disposer = (Disposer *)this_00;
      (this->connectionState).ptr = (RpcConnectionState *)0x0;
      (this->target).disposer = (Disposer *)0x0;
      (this->target).ptr = (RpcClient *)0x0;
      if ((PromiseArenaMember *)local_378.ownFile.content.disposer != (PromiseArenaMember *)0x0) {
        local_378.ownFile.content.disposer = (ArrayDisposer *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pAVar10);
      }
      sVar9 = local_378.ownFile.content.size_;
      if ((CapTableReader *)local_378.ownFile.content.size_ != (CapTableReader *)0x0) {
        local_378.ownFile.content.size_ = 0;
        (*(code *)**(undefined8 **)local_378.ownFile.content.ptr)
                  (local_378.ownFile.content.ptr,(char *)(sVar9 + (long)(*(_func_int ***)sVar9)[-2])
                  );
      }
    }
    else {
      pvVar6 = (this_01->callBuilder)._builder.data;
      uVar7 = *(undefined8 *)((long)pvVar6 + 8);
      uVar3 = *(ushort *)((long)pvVar6 + 4);
      PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
      MVar15 = PointerReader::targetSize((PointerReader *)&local_1e8);
      local_3d8 = (char *)MVar15.wordCount;
      local_3e0[0] = 1;
      local_3d0 = MVar15.capCount;
      StructBuilder::asReader(&(this_01->callBuilder)._builder);
      if ((uint)local_398._16_4_ < 0x82) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(byte *)(local_398._0_8_ + 0x10) >> 1 & 1;
      }
      if ((uint)local_398._16_4_ < 0x83) {
        uVar12 = 0;
      }
      else {
        uVar12 = (*(byte *)(local_398._0_8_ + 0x10) & 4) << 6;
      }
      __n_00 = (size_t)uVar3;
      puVar13 = local_3e0;
      (***(_func_int ***)sVar8)
                (local_398 + 0x20,sVar8,uVar7,__n_00,puVar13,(ulong)(uVar12 | uVar11),
                 local_58.segment._0_4_,local_58.capTable._0_4_,local_58.data._0_4_,
                 local_58.pointers._0_4_,local_58._32_8_);
      __flags_00 = (int)puVar13;
      PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
      other.capTable._0_4_ = (int)OStack_3c0.ptr;
      other.segment = (SegmentReader *)local_3c8;
      other.capTable._4_4_ = (int)((ulong)OStack_3c0.ptr >> 0x20);
      other.pointer._0_4_ = (int)local_3b8;
      other.pointer._4_4_ = (int)((ulong)local_3b8 >> 0x20);
      other.nestingLimit = (int)pFStack_3b0;
      other._28_4_ = (int)((ulong)pFStack_3b0 >> 0x20);
      PointerBuilder::copyFrom((PointerBuilder *)(local_398 + 0x20),other,false);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::send
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)local_398 + 0x20,
                 __buf_00,__n_00,__flags_00);
      uVar7 = local_378._32_8_;
      if ((Disposer *)local_378._32_8_ != (Disposer *)0x0) {
        local_378._32_8_ = (Disposer *)0x0;
        (***(_func_int ***)local_378.file)
                  (local_378.file,
                   (_func_int *)((long)(_func_int ***)uVar7 + (long)(*(_func_int ***)uVar7)[-2]));
      }
    }
    if ((CapTableReader *)sVar8 != (CapTableReader *)0x0) {
      (*(code *)((SegmentReader *)&local_400->port)->arena->_vptr_Arena)
                (local_400,(char *)(sVar8 + (long)(*(_func_int ***)sVar8)[-2]));
    }
  }
  else {
    other_00 = &(pRVar4->connection).field_1;
    kj::Exception::Exception((Exception *)(local_398 + 0x20),(Exception *)other_00);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_1e8,(Exception *)(local_398 + 0x20));
    kj::Exception::Exception(&local_1e8,(Exception *)other_00);
    newBrokenPipeline((capnp *)local_418,&local_1e8);
    (this->super_RequestHook)._vptr_RequestHook = (_func_int **)local_1e8.ownFile.content.ptr;
    (this->super_RequestHook).brand = (void *)local_418._0_8_;
    (this->connectionState).disposer = (Disposer *)local_418._8_8_;
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    (this->target).disposer = (Disposer *)0x0;
    (this->target).ptr = (RpcClient *)0x0;
    local_418._8_8_ = (PromiseArena *)0x0;
    kj::Exception::~Exception(&local_1e8);
    kj::Exception::~Exception((Exception *)(local_398 + 0x20));
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        bool noPromisePipelining = callBuilder.getNoPromisePipelining();

        auto sendResult = sendInternal(false);

        kj::Own<PipelineHook> pipeline;
        if (noPromisePipelining) {
          pipeline = getDisabledPipeline();
        } else {
          auto forkedPromise = sendResult.promise.fork();

          // The pipeline must get notified of resolution before the app does to maintain ordering.
          pipeline = kj::refcounted<RpcPipeline>(
              *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

          sendResult.promise = forkedPromise.addBranch();
        }

        auto appPromise = sendResult.promise.then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }